

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzintel.cpp
# Opt level: O2

void __thiscall
TPZInterpolatedElement::RestrainSide
          (TPZInterpolatedElement *this,int side,TPZInterpolatedElement *large,int neighbourside)

{
  double dVar1;
  byte bVar2;
  uint uVar3;
  REAL RVar4;
  int iVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long *plVar11;
  long lVar12;
  ostream *poVar13;
  TPZConnect *pTVar14;
  TPZGeoEl *pTVar15;
  TPZFNMatrix<1000,_double> *this_00;
  double *pdVar16;
  ulong uVar17;
  int64_t myindex;
  int64_t iVar18;
  TPZDepend *pTVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  long row;
  ulong uVar23;
  size_t lineN;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  bool bVar29;
  double dVar30;
  TPZAutoPointer<TPZMatrix<double>_> local_3578;
  int local_3570;
  uint local_356c;
  long *local_3568;
  ulong local_3560;
  REAL weight;
  TPZGeoElSide largegeoside;
  TPZGeoElSide thisgeoside;
  double local_3510;
  TPZCompElSide largecompside;
  TPZManVector<double,_3> pointl;
  TPZManVector<double,_3> par;
  TPZCompElSide thisside;
  TPZBlock MBlocksmall;
  TPZBlock MBlocklarge;
  TPZGeoElSide local_32d8;
  TPZFNMatrix<20,_double> blocknorm;
  TPZStepSolver<double> MSolve;
  TPZTransform<double> t;
  TPZFNMatrix<100,_double> phil;
  TPZFNMatrix<100,_double> dphil;
  TPZFNMatrix<100,_double> dphis;
  TPZFNMatrix<100,_double> phis;
  TPZFNMatrix<1000,_double> MSL;
  
  thisside.fEl = (TPZCompEl *)this;
  thisside.fSide = side;
  TPZCompElSide::Reference(&thisgeoside,&thisside);
  largecompside.fEl = (TPZCompEl *)large;
  largecompside.fSide = neighbourside;
  TPZCompElSide::Reference(&largegeoside,&largecompside);
  if ((largecompside.fEl == (TPZCompEl *)0x0) ||
     (plVar11 = (long *)__dynamic_cast(largecompside.fEl,&TPZCompEl::typeinfo,&typeinfo,0),
     plVar11 == (long *)0x0)) {
    poVar13 = std::operator<<((ostream *)&std::cout,
                              "Exiting RestrainSide - null computational element.");
    std::endl<char,std::char_traits<char>>(poVar13);
    return;
  }
  iVar5 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x310))
                    (this,side);
  if (iVar5 < 0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzintel.cpp",
               0x35c);
  }
  lVar12 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xa8))
                     (this,iVar5);
  if (*(int *)(lVar12 + 0x18) == 0) {
    return;
  }
  if ((*(long *)(lVar12 + 0x20) != 0) && (iVar5 = TPZGeoElSide::Dimension(&largegeoside), 0 < iVar5)
     ) {
    poVar13 = std::operator<<((ostream *)&std::cout,
                              "RestrainSide - unnecessary call to restrainside");
    std::endl<char,std::char_traits<char>>(poVar13);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzintel.cpp",
               0x365);
  }
  uVar6 = (**(code **)(*plVar11 + 0x310))(plVar11,largecompside.fSide);
  lVar12 = (**(code **)(*plVar11 + 0xa0))(plVar11,uVar6);
  if (lVar12 == -1) {
    poVar13 = std::operator<<((ostream *)&std::cout,
                              "Exiting RestrainSide - Side of large element not initialized");
    std::endl<char,std::char_traits<char>>(poVar13);
    lineN = 0x369;
  }
  else {
    iVar5 = TPZGeoElSide::Dimension(&largegeoside);
    iVar7 = TPZGeoElSide::Dimension(&thisgeoside);
    if (iVar7 <= iVar5) {
      iVar5 = TPZGeoElSide::Dimension(&thisgeoside);
      TPZTransform<double>::TPZTransform(&t,iVar5);
      local_32d8.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
      local_32d8.fGeoEl = largegeoside.fGeoEl;
      local_32d8.fSide = largegeoside.fSide;
      TPZGeoElSide::SideTransform3(&thisgeoside,&local_32d8,&t);
      iVar5 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x248))
                        (this,side);
      iVar7 = 0;
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      uVar21 = 1;
      for (; iVar5 != iVar7; iVar7 = iVar7 + 1) {
        pTVar14 = SideConnect(this,iVar7,side);
        bVar2 = (pTVar14->field_2).fCompose.fOrder;
        if (uVar21 <= bVar2) {
          uVar21 = (uint)bVar2;
        }
      }
      iVar5 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl + 0x338))
                        (large,neighbourside);
      lVar12 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x318))
                         (this,side);
      if ((((int)(uint)*(byte *)(lVar12 + 0x14) < iVar5) &&
          (iVar5 = TPZGeoElSide::Dimension(&thisgeoside), iVar5 != 0)) &&
         (iVar5 = TPZGeoElSide::Dimension(&largegeoside), iVar5 != 0)) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzintel.cpp"
                   ,0x37d);
      }
      pTVar15 = TPZCompEl::Reference((TPZCompEl *)this);
      plVar11 = (long *)(**(code **)(*(long *)pTVar15 + 0x70))(pTVar15,side,uVar21 * 2);
      if (plVar11 == (long *)0x0) {
        poVar13 = std::operator<<((ostream *)&std::cout,
                                  "Exiting RestrainSide - cannot create side integration rule");
        std::endl<char,std::char_traits<char>>(poVar13);
      }
      else {
        local_3568 = plVar11;
        iVar8 = (**(code **)(*plVar11 + 0x18))();
        iVar5 = NSideShapeF(this,side);
        iVar7 = TPZGeoElSide::Dimension(&thisgeoside);
        iVar9 = TPZGeoElSide::Dimension(&largegeoside);
        iVar10 = NSideShapeF(large,neighbourside);
        lVar12 = (long)iVar5;
        TPZFNMatrix<100,_double>::TPZFNMatrix(&phis,lVar12,1);
        TPZFNMatrix<100,_double>::TPZFNMatrix(&dphis,2,lVar12);
        uVar22 = (ulong)iVar10;
        TPZFNMatrix<100,_double>::TPZFNMatrix(&phil,uVar22,1);
        TPZFNMatrix<100,_double>::TPZFNMatrix(&dphil,2,uVar22);
        blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
        super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
        TPZFNMatrix<1000,_double>::TPZFNMatrix(&MSL,lVar12,uVar22,(double *)&blocknorm);
        this_00 = (TPZFNMatrix<1000,_double> *)operator_new(0x1fd8);
        blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
        super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
        TPZFNMatrix<1000,_double>::TPZFNMatrix(this_00,lVar12,lVar12,(double *)&blocknorm);
        TPZManVector<double,_3>::TPZManVector(&par,(long)iVar7);
        TPZManVector<double,_3>::TPZManVector(&pointl,(long)iVar9);
        uVar25 = 0;
        if ((long)uVar22 < 1) {
          uVar22 = uVar25;
        }
        lVar24 = 0;
        if (0 < lVar12) {
          lVar24 = lVar12;
        }
        if (iVar8 < 1) {
          iVar8 = 0;
        }
        while( true ) {
          if ((int)uVar25 == iVar8) break;
          (**(code **)(*local_3568 + 0x20))(local_3568,uVar25,&par,&weight);
          (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x288))
                    (this,side,&par,&phis,&dphis);
          TPZTransform<double>::Apply(&t,&par.super_TPZVec<double>,&pointl.super_TPZVec<double>);
          (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl + 0x288))
                    (large,neighbourside,&pointl,&phil,&dphil);
          for (lVar27 = 0; lVar27 != lVar24; lVar27 = lVar27 + 1) {
            for (row = 0; lVar12 != row; row = row + 1) {
              pdVar16 = TPZFMatrix<double>::operator()(&phis.super_TPZFMatrix<double>,lVar27,0);
              dVar30 = *pdVar16;
              pdVar16 = TPZFMatrix<double>::operator()(&phis.super_TPZFMatrix<double>,row,0);
              RVar4 = weight;
              dVar1 = *pdVar16;
              pdVar16 = TPZFMatrix<double>::operator()((TPZFMatrix<double> *)this_00,lVar27,row);
              *pdVar16 = dVar30 * dVar1 * RVar4 + *pdVar16;
            }
            for (uVar23 = 0; uVar22 != uVar23; uVar23 = uVar23 + 1) {
              pdVar16 = TPZFMatrix<double>::operator()(&phis.super_TPZFMatrix<double>,lVar27,0);
              dVar30 = *pdVar16;
              pdVar16 = TPZFMatrix<double>::operator()(&phil.super_TPZFMatrix<double>,uVar23,0);
              RVar4 = weight;
              dVar1 = *pdVar16;
              pdVar16 = TPZFMatrix<double>::operator()(&MSL.super_TPZFMatrix<double>,lVar27,uVar23);
              *pdVar16 = dVar30 * dVar1 * RVar4 + *pdVar16;
            }
          }
          uVar25 = (ulong)((int)uVar25 + 1);
        }
        TPZAutoPointer<TPZMatrix<double>>::TPZAutoPointer<TPZFNMatrix<1000,double>>
                  ((TPZAutoPointer<TPZMatrix<double>> *)&local_3578,this_00);
        TPZStepSolver<double>::TPZStepSolver(&MSolve,&local_3578);
        TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&local_3578);
        TPZStepSolver<double>::SetDirect(&MSolve,ELU);
        TPZStepSolver<double>::Solve
                  (&MSolve,&MSL.super_TPZFMatrix<double>,&MSL.super_TPZFMatrix<double>,
                   (TPZFMatrix<double> *)0x0);
        iVar5 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x248))
                          (this,side);
        iVar7 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl + 0x248)
                )(large);
        TPZBlock::TPZBlock(&MBlocksmall,(TPZBaseMatrix *)0x0,iVar5,1);
        TPZBlock::TPZBlock(&MBlocklarge,(TPZBaseMatrix *)0x0,iVar7,1);
        uVar22 = (ulong)iVar5;
        uVar25 = 0;
        local_3560 = 0;
        if (0 < (long)uVar22) {
          local_3560 = uVar22;
        }
        local_3570 = iVar5;
        for (; local_3560 != uVar25; uVar25 = uVar25 + 1) {
          uVar6 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x250
                              ))(this,uVar25 & 0xffffffff,side);
          lVar12 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xa8
                               ))(this,uVar6);
          TPZBlock::Set(&MBlocksmall,(int)uVar25,*(int *)(lVar12 + 0x18),-1);
        }
        uVar23 = (ulong)iVar7;
        uVar28 = 0;
        uVar25 = 0;
        if (0 < (long)uVar23) {
          uVar25 = uVar23;
        }
        for (; uVar25 != uVar28; uVar28 = uVar28 + 1) {
          uVar6 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl +
                              0x250))(large,uVar28 & 0xffffffff,neighbourside);
          lVar12 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl +
                               0xa8))(large,uVar6);
          TPZBlock::Set(&MBlocklarge,(int)uVar28,*(int *)(lVar12 + 0x18),-1);
        }
        TPZBlock::Resequence(&MBlocksmall,0);
        TPZBlock::Resequence(&MBlocklarge,0);
        local_3510 = 0.0;
        TPZFNMatrix<20,_double>::TPZFNMatrix(&blocknorm,uVar22,uVar23,&local_3510);
        for (uVar22 = 0; uVar22 != local_3560; uVar22 = uVar22 + 1) {
          uVar21 = MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[(int)uVar22].dim;
          if (uVar21 != 0) {
            uVar23 = 0;
            if (0 < (int)uVar21) {
              uVar23 = (ulong)uVar21;
            }
            for (uVar28 = 0; uVar28 != uVar25; uVar28 = uVar28 + 1) {
              uVar3 = MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[(int)uVar28].dim;
              if (uVar3 != 0) {
                iVar5 = MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[(int)uVar22].pos;
                iVar7 = MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[(int)uVar28].pos;
                uVar17 = 0;
                if (0 < (int)uVar3) {
                  uVar17 = (ulong)uVar3;
                }
                local_356c = uVar3;
                for (uVar20 = 0; uVar20 != uVar23; uVar20 = uVar20 + 1) {
                  lVar12 = uVar20 + (long)iVar5;
                  lVar24 = (long)iVar7;
                  uVar26 = uVar17;
                  while (bVar29 = uVar26 != 0, uVar26 = uVar26 - 1, bVar29) {
                    pdVar16 = TPZFMatrix<double>::operator()
                                        (&MSL.super_TPZFMatrix<double>,lVar12,lVar24);
                    dVar30 = *pdVar16;
                    pdVar16 = TPZFMatrix<double>::operator()
                                        (&MSL.super_TPZFMatrix<double>,lVar12,lVar24);
                    dVar1 = *pdVar16;
                    pdVar16 = TPZFMatrix<double>::operator()
                                        (&blocknorm.super_TPZFMatrix<double>,uVar22,uVar28);
                    *pdVar16 = ABS(dVar1) * ABS(dVar30) + *pdVar16;
                    lVar24 = lVar24 + 1;
                  }
                }
                pdVar16 = TPZFMatrix<double>::operator()
                                    (&blocknorm.super_TPZFMatrix<double>,uVar22,uVar28);
                *pdVar16 = *pdVar16 / (double)(int)(local_356c * uVar21);
                pdVar16 = TPZFMatrix<double>::operator()
                                    (&blocknorm.super_TPZFMatrix<double>,uVar22,uVar28);
                dVar30 = *pdVar16;
                if (dVar30 < 0.0) {
                  dVar30 = sqrt(dVar30);
                }
                else {
                  dVar30 = SQRT(dVar30);
                }
                pdVar16 = TPZFMatrix<double>::operator()
                                    (&blocknorm.super_TPZFMatrix<double>,uVar22,uVar28);
                *pdVar16 = dVar30;
              }
            }
          }
        }
        uVar6 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x310))
                          (this,side);
        pTVar14 = (TPZConnect *)
                  (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xa8)
                  )(this,uVar6);
        uVar6 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x310))
                          (this,side);
        myindex = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xa0)
                  )(this,uVar6);
        lVar27 = (long)(local_3570 + -1);
        lVar12 = 0xc;
        lVar24 = 0;
        for (uVar22 = 0; uVar25 != uVar22; uVar22 = uVar22 + 1) {
          if ((MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[lVar27].dim != 0) &&
             (*(int *)((long)&((MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fStore)->
                              super_TPZSavable)._vptr_TPZSavable + lVar12) != 0)) {
            iVar18 = SideConnectIndex(large,(int)uVar22,neighbourside);
            pTVar19 = TPZConnect::AddDependency
                                (pTVar14,myindex,iVar18,&MSL.super_TPZFMatrix<double>,
                                 (long)MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore
                                       [lVar27].pos,
                                 (long)*(int *)((long)MBlocklarge.fBlock.
                                                      super_TPZVec<TPZBlock::TNode>.fStore +
                                               lVar12 + -4),
                                 MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[lVar27].dim
                                 ,*(int *)((long)&((MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>
                                                   .fStore)->super_TPZSavable)._vptr_TPZSavable +
                                          lVar12));
            pdVar16 = TPZFMatrix<double>::operator()
                                (&blocknorm.super_TPZFMatrix<double>,lVar27,uVar22);
            if (*pdVar16 <= 1e-08 && *pdVar16 != 1e-08) {
              memset((pTVar19->fDepMatrix).super_TPZFMatrix<double>.fElem,0,
                     (pTVar19->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                     super_TPZBaseMatrix.fRow *
                     (pTVar19->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                     super_TPZBaseMatrix.fCol * 8);
              (pTVar19->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
              super_TPZBaseMatrix.fDecomposed = '\0';
            }
            lVar24 = lVar24 + 1;
          }
          lVar12 = lVar12 + 0x10;
        }
        if (lVar24 == 0) {
          lVar12 = 0xc;
          for (uVar22 = 0; uVar25 != uVar22; uVar22 = uVar22 + 1) {
            iVar18 = SideConnectIndex(large,(int)uVar22,neighbourside);
            iVar5 = *(int *)((long)&((MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fStore)->
                                    super_TPZSavable)._vptr_TPZSavable + lVar12);
            if (iVar5 != 0) {
              TPZConnect::AddDependency
                        (pTVar14,myindex,iVar18,&MSL.super_TPZFMatrix<double>,
                         (long)MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[lVar27].pos,
                         (long)*(int *)((long)MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.
                                              fStore + lVar12 + -4),
                         MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[lVar27].dim,iVar5);
            }
            lVar12 = lVar12 + 0x10;
          }
        }
        (**(code **)(*local_3568 + 8))();
        TPZFNMatrix<20,_double>::~TPZFNMatrix(&blocknorm);
        TPZBlock::~TPZBlock(&MBlocklarge);
        TPZBlock::~TPZBlock(&MBlocksmall);
        TPZStepSolver<double>::~TPZStepSolver(&MSolve);
        TPZManVector<double,_3>::~TPZManVector(&pointl);
        TPZManVector<double,_3>::~TPZManVector(&par);
        TPZFNMatrix<1000,_double>::~TPZFNMatrix(&MSL);
        TPZFNMatrix<100,_double>::~TPZFNMatrix(&dphil);
        TPZFNMatrix<100,_double>::~TPZFNMatrix(&phil);
        TPZFNMatrix<100,_double>::~TPZFNMatrix(&dphis);
        TPZFNMatrix<100,_double>::~TPZFNMatrix(&phis);
      }
      TPZTransform<double>::~TPZTransform(&t);
      return;
    }
    poVar13 = std::operator<<((ostream *)&std::cout,
                              "Exiting RestrainSide - Trying to restrict to a side of smaller dimension"
                             );
    std::endl<char,std::char_traits<char>>(poVar13);
    lineN = 0x36e;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzintel.cpp",
             lineN);
}

Assistant:

void TPZInterpolatedElement::RestrainSide(int side, TPZInterpolatedElement *large, int neighbourside) {
    TPZCompElSide thisside(this, side);
    TPZGeoElSide thisgeoside = thisside.Reference();
    TPZCompElSide largecompside(large, neighbourside);
    TPZGeoElSide largegeoside = largecompside.Reference();
    TPZInterpolatedElement *cel = nullptr;
    if (largecompside.Exists()) cel = dynamic_cast<TPZInterpolatedElement *> (largecompside.Element());
    if (!cel) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - null computational element.");
        return;
    }
    int locind = MidSideConnectLocId(side);
    if (locind < 0) {
        DebugStop();
    }
    TPZConnect &myconnect = Connect(locind);
    if (myconnect.NShape() == 0) {
        /// no shape functions to restrain
        return;
    }
    if (myconnect.HasDependency() && largegeoside.Dimension() > 0) {
        LOGPZ_WARN(logger, "RestrainSide - unnecessary call to restrainside");
        DebugStop();
    }
    if (cel->ConnectIndex(cel->MidSideConnectLocId(largecompside.Side())) == -1) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - Side of large element not initialized");
        DebugStop();
        return;
    }
    if (largegeoside.Dimension() < thisgeoside.Dimension()) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - Trying to restrict to a side of smaller dimension");
        DebugStop();
        return;
    }
    TPZTransform<> t(thisgeoside.Dimension());
    thisgeoside.SideTransform3(largegeoside, t);
    int nsideconnects = NSideConnects(side);
    int maxord = 1;
    for (int sidecon = 0; sidecon < nsideconnects; sidecon++) {
        TPZConnect &c = SideConnect(sidecon, side);
        int sideord = c.Order();
        maxord = maxord < sideord ? sideord : maxord;
    }
    int largeorder = large->EffectiveSideOrder(neighbourside);
    int sideorder = MidSideConnect(side).Order();
    if (sideorder < largeorder && thisgeoside.Dimension() && largegeoside.Dimension()) {
        DebugStop();
    }
    TPZIntPoints *intrule = Reference()->CreateSideIntegrationRule(side, maxord * 2);
    if (!intrule) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - cannot create side integration rule");
        return;
    }
    int numint = intrule->NPoints();
    int numshape = NSideShapeF(side);
    int sidedimension = thisgeoside.Dimension();
    int largesidedimension = largegeoside.Dimension();
    int numshapel = large->NSideShapeF(neighbourside);
    TPZFNMatrix<100, REAL> phis(numshape, 1), dphis(2, numshape), phil(numshapel, 1), dphil(2, numshapel);
    TPZFNMatrix<1000, REAL> MSL(numshape, numshapel, 0.);
    TPZFNMatrix<1000, REAL> *M = new TPZFNMatrix<1000, REAL>(numshape, numshape, 0.);
    TPZManVector<REAL, 3> par(sidedimension), pointl(largesidedimension); //,point(3);
    int64_t in, jn;
    REAL weight;
    for (int it = 0; it < numint; it++) {
        intrule->Point(it, par, weight);
        SideShapeFunction(side, par, phis, dphis);
        t.Apply(par, pointl);
        large->SideShapeFunction(neighbourside, pointl, phil, dphil);
        for (in = 0; in < numshape; in++) {
            for (jn = 0; jn < numshape; jn++) {
                (*M)(in, jn) += phis(in, 0) * phis(jn, 0) * weight;
            }
            for (jn = 0; jn < numshapel; jn++) {
                MSL(in, jn) += phis(in, 0) * phil(jn, 0) * weight;
            }
        }
    }
#ifdef PZ_LOG_keep
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        M->Print("MSS = ", sout, EMathematicaInput);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    TPZStepSolver<REAL> MSolve(M);
    MSolve.SetDirect(ELU);

    MSolve.Solve(MSL, MSL);

    //MSolve.ResetMatrix();
    int numsidenodes_small = NSideConnects(side);
    // Philippe 12/3/99
    //  int numsidenodes_large = NSideConnects(neighbourside);
    int numsidenodes_large = large->NSideConnects(neighbourside);
    TPZBlock MBlocksmall(0, numsidenodes_small), MBlocklarge(0, numsidenodes_large);
    for (in = 0; in < numsidenodes_small; in++) {
        int locid = SideConnectLocId(in, side);
        TPZConnect &c = Connect(locid);
#ifdef PZDEBUG
        if (NConnectShapeF(locid, c.Order()) != c.NShape()) {
            DebugStop();
        }
#endif
        unsigned int nshape = c.NShape();
        MBlocksmall.Set(in, nshape);
    }
    for (in = 0; in < numsidenodes_large; in++) {
        int locid = large->SideConnectLocId(in, neighbourside);
        TPZConnect &c = large->Connect(locid);
        unsigned int nshape = c.NShape();
#ifdef PZDEBUG
        if (large->NConnectShapeF(locid, c.Order()) != nshape) {
            DebugStop();
        }
#endif
        MBlocklarge.Set(in, nshape);
    }

    MBlocksmall.Resequence();
    MBlocklarge.Resequence();
    TPZFNMatrix<20, REAL> blocknorm(numsidenodes_small, numsidenodes_large, 0.);
    for (in = 0; in < numsidenodes_small; in++) {
        int ibl = MBlocksmall.Size(in);
        if (!ibl) continue;
        for (jn = 0; jn < numsidenodes_large; jn++) {
            int jbl = MBlocklarge.Size(jn);
            if (!jbl) continue;
            int i, j;
            int64_t ipos = MBlocksmall.Position(in);
            int64_t jpos = MBlocklarge.Position(jn);
            for (i = 0; i < ibl; i++) for (j = 0; j < jbl; j++) blocknorm(in, jn) += fabs(MSL(ipos + i, jpos + j)) * fabs(MSL(ipos + i, jpos + j));
            blocknorm(in, jn) /= (ibl * jbl);
            blocknorm(in, jn) = sqrt(blocknorm(in, jn));
        }
    }
#ifdef PZDEBUG
    CheckConstraintConsistency(side);
#endif
    TPZConnect &inod = Connect(MidSideConnectLocId(side));
    int64_t inodindex = ConnectIndex(MidSideConnectLocId(side));
    int64_t ndepend = 0;
    in = numsidenodes_small - 1;
#ifdef PZDEBUG
    if (MBlocksmall.Size(in) == 0) {
        DebugStop();
    }
#endif
    for (jn = 0; jn < numsidenodes_large; jn++) {
        if (MBlocksmall.Size(in) == 0 || MBlocklarge.Size(jn) == 0) {
            continue;
        }
        int64_t jnodindex = large->SideConnectIndex(jn, neighbourside);
        TPZConnect::TPZDepend *depend = inod.AddDependency(inodindex, jnodindex, MSL, MBlocksmall.Position(in), MBlocklarge.Position(jn),
                MBlocksmall.Size(in), MBlocklarge.Size(jn));
        if (blocknorm(in, jn) < 1.e-8) {
            depend->fDepMatrix.Zero();
        }
        ndepend++;
    }

    if (!ndepend) {
        //cout << "Caso esquisito!!! Chame o Boss que vc receberem premio\n";
        for (jn = 0; jn < numsidenodes_large; jn++) {
            int64_t jnodindex = large->SideConnectIndex(jn, neighbourside);
            if (MBlocklarge.Size(jn)) {
                inod.AddDependency(inodindex, jnodindex, MSL, MBlocksmall.Position(in), MBlocklarge.Position(jn),
                        MBlocksmall.Size(in), MBlocklarge.Size(jn));
            }
            ndepend++;
        }
    }
    delete intrule;

#ifdef HUGE_DEBUG
    // a matriz frestraint deveria ser igual a MSL
    TPZCheckRestraint test(thisside, largecompside);
    //test.Print(cout);
    int64_t imsl, jmsl;
    int64_t rmsl = MSL.Rows();
    int64_t cmsl = MSL.Cols();
    int64_t rtest = test.RestraintMatrix().Rows();
    int64_t ctest = test.RestraintMatrix().Cols();

    if (rtest != rmsl || ctest != cmsl) {
        stringstream sout;
        sout << "Exiting - Restraint matrix side incompatibility: MSL (rows,cols): ( " << rmsl
                << " , " << cmsl << " )" << " RestraintMatrix (rows,cols): (" << rtest << " , " << ctest << " )\n"
                << "press any key to continue";
        LOGPZ_ERROR(logger, sout.str());
        int a;
        cin >> a;
        return;
    }

    TPZFMatrix<REAL> mslc(MSL);
    mslc -= test.RestraintMatrix();

    REAL normmsl = 0.;
    for (imsl = 0; imsl < rmsl; imsl++) {
        for (jmsl = 0; jmsl < cmsl; jmsl++) {
            normmsl += sqrt(mslc(imsl, jmsl) * mslc(imsl, jmsl));
        }
    }
    if (normmsl > 1.E-6) {
        stringstream sout;
        sout << "TPZInterpolatedElement::Error::MSL matrix has non zero norm " << normmsl << "\n";
        mslc.Print("Difference Matrix ", sout);
        for (imsl = 0; imsl < rmsl; imsl++) {
            for (jmsl = 0; jmsl < cmsl; jmsl++) {
                if (fabs(MSL(imsl, jmsl) - test.RestraintMatrix()(imsl, jmsl)) > 1.E-6) {
                    sout << "msl[ " << imsl << " , " << jmsl << " ] = " << MSL(imsl, jmsl) << "\t "
                            << test.RestraintMatrix()(imsl, jmsl) << endl;
                }
            }
        }
        LOGPZ_ERROR(logger, sout.str());
        //     int a;
        //     gDebug = 1;
        //     cin >> a;
    }

    // verificar a norma de MSL
    if (test.CheckRestraint()) {
        stringstream sout
        sout << "TPZInterpolatedElement::Error::Bad restraints detected\n"; // recado de erro.
        test.Print(sout);
        //     int a;
        //     gDebug = 1;
        //     cin >> a;
        test.Diagnose();
        LOGPZ_ERROR(logger, sout.str());
        TPZCheckRestraint test2(thisside, largecompside);
    }
#endif
}